

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemUtils.h
# Opt level: O0

Path * __thiscall FileSystemUtils::Path::ParentPath(Path *__return_storage_ptr__,Path *this)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  string local_58;
  ulong local_38;
  size_t pos;
  undefined1 local_19;
  Path *local_18;
  Path *this_local;
  Path *parentpath;
  
  local_19 = 0;
  local_18 = this;
  this_local = __return_storage_ptr__;
  Path(__return_storage_ptr__,&this->m_string);
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 0) {
    while( true ) {
      lVar1 = std::__cxx11::string::find_last_of((char *)&__return_storage_ptr__->m_string,0x204e8e)
      ;
      lVar2 = std::__cxx11::string::length();
      if (lVar1 != lVar2 + -1) break;
      lVar1 = std::__cxx11::string::length();
      std::__cxx11::string::erase((ulong)&__return_storage_ptr__->m_string,lVar1 - 1);
    }
    uVar3 = std::__cxx11::string::find_last_of((char *)&__return_storage_ptr__->m_string,0x204e8e);
    local_38 = uVar3;
    uVar4 = std::__cxx11::string::length();
    if (uVar3 < uVar4) {
      std::__cxx11::string::substr((ulong)&local_58,(ulong)&__return_storage_ptr__->m_string);
      operator=(__return_storage_ptr__,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      while( true ) {
        lVar1 = std::__cxx11::string::find_last_of
                          ((char *)&__return_storage_ptr__->m_string,0x204e8e);
        lVar2 = std::__cxx11::string::length();
        if (lVar1 != lVar2 + -1) break;
        lVar1 = std::__cxx11::string::length();
        std::__cxx11::string::erase((ulong)&__return_storage_ptr__->m_string,lVar1 - 1);
      }
    }
    else {
      operator=(__return_storage_ptr__,"");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Path Path::ParentPath() const
	{
		Path parentpath = m_string;

        if( parentpath.m_string.length() == 0 )
        {
            return parentpath;
        }
		//remove any trailing seperators
		while( parentpath.m_string.find_last_of( FILESYSTEMUTILS_SEPERATORS ) == parentpath.m_string.length()-1 )
		{
			parentpath.m_string.erase(parentpath.m_string.length()-1, 1);
		}

		size_t pos = parentpath.m_string.find_last_of( FILESYSTEMUTILS_SEPERATORS );
		if( pos < parentpath.m_string.length() )
		{
			parentpath = parentpath.m_string.substr(0, pos);

			//remove any trailing seperators
			while( parentpath.m_string.find_last_of( FILESYSTEMUTILS_SEPERATORS ) == parentpath.m_string.length()-1)
			{
                parentpath.m_string.erase(parentpath.m_string.length()-1, 1);
			}
		}
		else
		{
			// no seperators, so parentpath is empty path
			parentpath = "";
		}

		return parentpath;
	}